

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::NormalizeSignature(ByteData *__return_storage_ptr__,ByteData *signature)

{
  pointer *this;
  uchar *sig_00;
  size_type sig_len;
  uchar *bytes_out;
  size_type len;
  CfdException *this_00;
  allocator local_99;
  string local_98;
  CfdSourceLocation local_78;
  int local_60 [2];
  int ret;
  allocator<unsigned_char> local_49;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  ByteData *signature_local;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,signature);
  ::std::allocator<unsigned_char>::allocator(&local_49);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0x40,&local_49);
  ::std::allocator<unsigned_char>::~allocator(&local_49);
  this = &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  sig_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  sig_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  local_60[0] = wally_ec_sig_normalize(sig_00,sig_len,bytes_out,len);
  if (local_60[0] != 0) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x30e;
    local_78.funcname = "NormalizeSignature";
    logger::warn<int&>(&local_78,"wally_ec_sig_normalize NG[{}].",local_60);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_98,"ec normalize error.",&local_99);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_98);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::NormalizeSignature(const ByteData &signature) {
  std::vector<uint8_t> sig = signature.GetBytes();
  std::vector<uint8_t> output(EC_SIGNATURE_LEN);
  int ret = wally_ec_sig_normalize(
      sig.data(), sig.size(), output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_sig_normalize NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "ec normalize error.");
  }
  return ByteData(output);
}